

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

void __thiscall despot::Pocman::NewLevel(Pocman *this,PocmanState *pocstate)

{
  Grid<int> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  undefined7 uVar3;
  int g;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  int x;
  int x_00;
  int y;
  int y_00;
  double dVar7;
  reference rVar8;
  
  uVar3 = *(undefined7 *)&this->field_0x3d;
  pocstate->pocman_pos = this->pocman_home_;
  *(undefined7 *)&pocstate->field_0x21 = uVar3;
  for (uVar5 = 0; (long)uVar5 < (long)this->num_ghosts_; uVar5 = uVar5 + 1) {
    *(undefined8 *)
     ((pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
      _M_impl.super__Vector_impl_data._M_start + uVar5 * 8) = *(undefined8 *)&this->ghost_home_;
    pCVar2 = (pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = pCVar2 + uVar5 * 8;
    *(uint *)pCVar1 = *(int *)pCVar1 + ((uint)uVar5 & 1);
    pCVar2 = pCVar2 + uVar5 * 8 + 4;
    *(uint *)pCVar2 = *(int *)pCVar2 + ((uint)(uVar5 >> 1) & 0x7fffffff);
    (pocstate->ghost_dir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = -1;
  }
  pocstate->num_food = 0;
  this_00 = &this->maze_;
  x_00 = 0;
  do {
    if (this_00->xsize_ <= x_00) {
      pocstate->power_steps = 0;
      return;
    }
    for (y_00 = 0; y_00 < (this->maze_).ysize_; y_00 = y_00 + 1) {
      iVar4 = Grid<int>::Index(this_00,x_00,y_00);
      pbVar6 = (byte *)Grid<int>::operator()(this_00,x_00,y_00);
      if ((*pbVar6 & 2) == 0) {
LAB_0010b3cd:
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&pocstate->food,(long)iVar4);
        *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
      }
      else {
        pbVar6 = (byte *)Grid<int>::operator()(this_00,x_00,y_00);
        if ((*pbVar6 & 4) == 0) {
          dVar7 = (double)despot::Random::NextDouble();
          if (this->food_prob_ <= dVar7) goto LAB_0010b3cd;
        }
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&pocstate->food,(long)iVar4);
        *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
        pocstate->num_food = pocstate->num_food + 1;
      }
    }
    x_00 = x_00 + 1;
  } while( true );
}

Assistant:

void Pocman::NewLevel(PocmanState& pocstate) const {
	pocstate.pocman_pos = pocman_home_;
	for (int g = 0; g < num_ghosts_; g++) {
		pocstate.ghost_pos[g] = ghost_home_;
		pocstate.ghost_pos[g].x += g % 2;
		pocstate.ghost_pos[g].y += g / 2;
		pocstate.ghost_dir[g] = -1;
	}

	pocstate.num_food = 0;
	for (int x = 0; x < maze_.xsize(); x++) {
		for (int y = 0; y < maze_.ysize(); y++) {
			int pocIndex = maze_.Index(x, y);
			// cout << maze_(x, y) << " " << CheckFlag(maze_(x, y), E_SEED) << " " << CheckFlag(maze_(x, y), E_POWER) << endl;
			if (CheckFlag(maze_(x, y), E_SEED)
				&& (CheckFlag(maze_(x, y), E_POWER)
					|| Random::RANDOM.NextDouble() < food_prob_)) {
				pocstate.food[pocIndex] = 1;
				pocstate.num_food++;
			} else {
				pocstate.food[pocIndex] = 0;
			}
		}
	}

	pocstate.power_steps = 0;
}